

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O2

ON_Brep * __thiscall ON_Hatch::BrepForm(ON_Hatch *this,ON_Brep *brep)

{
  uint uVar1;
  ON_Curve *pOVar2;
  int iVar3;
  ON_PlaneSurface *this_00;
  ulong uVar4;
  ON_BrepFace *pOVar5;
  long lVar6;
  ON_Plane *pOVar7;
  ON_Plane *pOVar8;
  ulong uVar9;
  byte bVar10;
  ON_Curve *edgecurve;
  ON_Interval local_118;
  ON_Interval local_108;
  ON_SimpleArray<ON_Curve_*> bounds;
  ON_BoundingBox bbox;
  ON_Plane plane;
  
  bVar10 = 0;
  if (brep == (ON_Brep *)0x0) {
    brep = ON_Brep::New();
    if (brep == (ON_Brep *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_hatch.cpp"
                 ,0x716,"","Unable to get allocate brep.");
      return (ON_Brep *)0x0;
    }
  }
  else {
    ON_Brep::Destroy(brep);
  }
  pOVar7 = &this->m_plane;
  pOVar8 = &plane;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pOVar8->origin).x = (pOVar7->origin).x;
    pOVar7 = (ON_Plane *)((long)pOVar7 + (ulong)bVar10 * -0x10 + 8);
    pOVar8 = (ON_Plane *)((long)pOVar8 + (ulong)bVar10 * -0x10 + 8);
  }
  this_00 = (ON_PlaneSurface *)operator_new(0xd0);
  ON_PlaneSurface::ON_PlaneSurface(this_00,&plane);
  uVar1 = (this->m_loops).m_count;
  uVar9 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar9;
  }
  iVar3 = -1;
  for (; uVar4 != uVar9; uVar9 = uVar9 + 1) {
    pOVar2 = (this->m_loops).m_a[uVar9]->m_p2dCurve;
    edgecurve = LoopCurve3d(this,(int)uVar9);
    bounds._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081dee8;
    bounds.m_a = (ON_Curve **)0x0;
    bounds.m_count = 0;
    bounds.m_capacity = 0;
    ON_SimpleArray<ON_Curve_*>::Append(&bounds,&edgecurve);
    if (uVar9 == 0) {
      ON_BoundingBox::ON_BoundingBox(&bbox);
      (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x19])
                (pOVar2,&bbox,&bbox.m_max,0);
      ON_Interval::ON_Interval(&local_108,bbox.m_min.x + -1.0,bbox.m_max.x + 1.0);
      ON_PlaneSurface::SetExtents(this_00,0,local_108,true);
      ON_Interval::ON_Interval(&local_118,bbox.m_min.y + -1.0,bbox.m_max.y + 1.0);
      ON_PlaneSurface::SetExtents(this_00,1,local_118,true);
      iVar3 = ON_Brep::AddSurface(brep,(ON_Surface *)this_00);
      pOVar5 = ON_Brep::NewFace(brep,iVar3);
      iVar3 = pOVar5->m_face_index;
      ON_Brep::NewPlanarFaceLoop(brep,iVar3,outer,&bounds,false);
    }
    else {
      ON_Brep::NewPlanarFaceLoop(brep,iVar3,inner,&bounds,false);
    }
    ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&bounds);
  }
  ON_Brep::SetTolerancesBoxesAndFlags(brep,false,true,true,true,true,true,true,true);
  ON_Plane::~ON_Plane(&plane);
  return brep;
}

Assistant:

ON_Brep* ON_Hatch::BrepForm(ON_Brep* brep) const
{
  if (brep)
    brep->Destroy();

  ON_Brep* newbrep = brep ? brep : ON_Brep::New();

  if (0 == newbrep)
  {
    ON_ERROR("Unable to get allocate brep.");
    return 0;
  }
  brep = newbrep;

  ON_Plane plane = Plane();
  ON_PlaneSurface* srf = new ON_PlaneSurface(plane);
  int srf_i = -1, face_i = -1;

  int loopcount = LoopCount();
  for (int i = 0; i < loopcount; i++)
  {
    const ON_HatchLoop* loop = Loop(i);
    const ON_Curve* loopcurve = loop->Curve();
    ON_Curve* edgecurve = this->LoopCurve3d(i);
    ON_SimpleArray< ON_Curve* > bounds;
    bounds.Append(edgecurve);

    if (i == 0)
    {
      ON_BoundingBox bbox;
      loopcurve->GetBBox(&bbox.m_min.x, &bbox.m_max.x, false);
      srf->SetExtents(0, ON_Interval(bbox.m_min.x - 1.0, bbox.m_max.x + 1.0), true);
      srf->SetExtents(1, ON_Interval(bbox.m_min.y - 1.0, bbox.m_max.y + 1.0), true);
      srf_i = brep->AddSurface(srf);
      ON_BrepFace& face = brep->NewFace(srf_i);
      face_i = face.m_face_index;
      brep->NewPlanarFaceLoop(face_i, ON_BrepLoop::TYPE::outer, bounds, false);
    }
    else
      brep->NewPlanarFaceLoop(face_i, ON_BrepLoop::TYPE::inner, bounds, false);
  }
  brep->SetTolerancesBoxesAndFlags();

  return brep;
}